

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O2

void canvas_obj(_glist *gl,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  _binbuf *p_Var2;
  t_symbol *sel;
  _glist *x;
  _glist *extraout_RAX;
  _glist *extraout_RAX_00;
  _glist *p_Var3;
  _glist *x_00;
  void *data;
  t_float tVar4;
  t_float tVar5;
  int nobj;
  int indx;
  int ypix;
  int xpix;
  int connectme;
  
  if (1 < argc) {
    p_Var2 = binbuf_new();
    binbuf_restore(p_Var2,argc + -2,argv + 2);
    tVar4 = atom_getfloatarg(0,argc,argv);
    tVar5 = atom_getfloatarg(1,argc,argv);
    canvas_objtext(gl,(int)tVar4,(int)tVar5,0,0,p_Var2);
    return;
  }
  iVar1 = glist_isvisible(gl);
  if (iVar1 != 0) {
    p_Var2 = binbuf_new();
    canvas_howputnew(gl,&connectme,&xpix,&ypix,&indx,&nobj);
    sel = gensym("editmode");
    pd_vmess((t_pd *)gl,sel,"i");
    canvas_objtext(gl,xpix,ypix,0,1,p_Var2);
    if (connectme == 0) {
      p_Var3 = glist_getcanvas(x);
      canvas_startmotion(p_Var3);
      p_Var3 = extraout_RAX_00;
    }
    else {
      canvas_connect(gl,(float)indx,0.0,(float)nobj,0.0);
      p_Var3 = extraout_RAX;
    }
    p_Var3 = glist_getcanvas(p_Var3);
    p_Var3 = (_glist *)canvas_undo_get(p_Var3);
    if (*(int *)&(p_Var3->gl_obj).te_outlet == 0) {
      p_Var3 = glist_getcanvas(p_Var3);
      x_00 = glist_getcanvas(p_Var3);
      data = canvas_undo_set_create(x_00);
      canvas_undo_add(p_Var3,UNDO_CREATE,"create",data);
    }
    return;
  }
  post("unable to create stub object in closed canvas!");
  return;
}

Assistant:

void canvas_obj(t_glist *gl, t_symbol *s, int argc, t_atom *argv)
{
    t_text *x;
    if (argc >= 2)
    {
        t_binbuf *b = binbuf_new();
        binbuf_restore(b, argc-2, argv+2);
        canvas_objtext(gl, atom_getfloatarg(0, argc, argv),
            atom_getfloatarg(1, argc, argv), 0, 0, b);
    }
        /* JMZ: don't go into interactive mode in a closed canvas */
    else if (!glist_isvisible(gl))
        post("unable to create stub object in closed canvas!");
    else
    {
            /* interactively create new object */
        t_binbuf *b = binbuf_new();
        int connectme, xpix, ypix, indx, nobj;
        canvas_howputnew(gl, &connectme, &xpix, &ypix, &indx, &nobj);
        pd_vmess(&gl->gl_pd, gensym("editmode"), "i", 1);
        canvas_objtext(gl, xpix, ypix, 0, 1, b);
        if (connectme)
            canvas_connect(gl, indx, 0, nobj, 0);
        else canvas_startmotion(glist_getcanvas(gl));
        if (!canvas_undo_get(glist_getcanvas(gl))->u_doing)
            canvas_undo_add(glist_getcanvas(gl), UNDO_CREATE, "create",
                (void *)canvas_undo_set_create(glist_getcanvas(gl)));
    }
}